

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * QUtil::win_ansi_to_utf8(string *__return_storage_ptr__,string *val)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_short uVar4;
  ulong uVar5;
  ulong uVar6;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = val->_M_string_length;
  if (uVar2 != 0) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (val->_M_string_length <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      bVar1 = (val->_M_dataplus)._M_p[uVar5];
      uVar4 = (unsigned_short)bVar1;
      if ((char)bVar1 < -0x5f) {
        uVar4 = win_ansi_to_unicode[bVar1 & 0x3f];
      }
      toUTF8_abi_cxx11_(&local_50,(QUtil *)(ulong)uVar4,val->_M_string_length);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = uVar6 < uVar2;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::win_ansi_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if ((ch >= 128) && (ch <= 160)) {
            ch_short = win_ansi_to_unicode[ch - 128];
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}